

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateReader.cpp
# Opt level: O0

EStatusCode __thiscall StateReader::Start(StateReader *this,string *inStateFilePath)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  undefined8 uVar3;
  IByteReaderWithPosition *inSourceStream;
  PDFDictionary *this_00;
  PDFObject *inPDFObject;
  PDFIndirectObjectReference *pPVar4;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  PDFObjectCastPtr<PDFIndirectObjectReference> rootObject;
  string *inStateFilePath_local;
  StateReader *this_local;
  
  rootObject.super_RefCountPtr<PDFIndirectObjectReference>.mValue =
       (PDFIndirectObjectReference *)inStateFilePath;
  EVar1 = InputFile::OpenFile(&this->mInputFile,inStateFilePath);
  if (EVar1 == eSuccess) {
    inSourceStream = InputFile::GetInputStream(&this->mInputFile);
    EVar1 = PDFParser::StartStateFileParsing(&this->mParser,inSourceStream);
    if (EVar1 == eSuccess) {
      this_00 = PDFParser::GetTrailer(&this->mParser);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Root",&local_51);
      inPDFObject = PDFDictionary::QueryDirectObject(this_00,&local_50);
      PDFObjectCastPtr<PDFIndirectObjectReference>::PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_30,inPDFObject);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      pPVar4 = RefCountPtr<PDFIndirectObjectReference>::operator->
                         ((RefCountPtr<PDFIndirectObjectReference> *)local_30);
      this->mRootObject = pPVar4->mObjectID;
      this_local._4_4_ = eSuccess;
      PDFObjectCastPtr<PDFIndirectObjectReference>::~PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_30);
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "StateReader::Start, unable to start parsing for the state reader file");
      this_local._4_4_ = eFailure;
    }
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    uVar3 = std::__cxx11::string::c_str();
    Trace::TraceToLog(pTVar2,"StateReader::Start, can\'t open file for state reading in %s",uVar3);
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode StateReader::Start(const std::string& inStateFilePath)
{
	// open the new file...
	if(mInputFile.OpenFile(inStateFilePath) != PDFHummus::eSuccess)
	{
		TRACE_LOG1("StateReader::Start, can't open file for state reading in %s",inStateFilePath.c_str());
		return PDFHummus::eFailure;
	}
	
	if(mParser.StartStateFileParsing(mInputFile.GetInputStream()) != PDFHummus::eSuccess)
	{
		TRACE_LOG("StateReader::Start, unable to start parsing for the state reader file");
		return PDFHummus::eFailure;
	}

	// set the root object
	PDFObjectCastPtr<PDFIndirectObjectReference> rootObject(mParser.GetTrailer()->QueryDirectObject("Root"));
	mRootObject = rootObject->mObjectID;

	return PDFHummus::eSuccess;
}